

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int amqpvalue_get_target(AMQP_VALUE value,TARGET_HANDLE *target_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  TARGET_HANDLE pTVar3;
  AMQP_VALUE pAVar4;
  AMQP_VALUE pAVar5;
  uint32_t list_item_count;
  terminus_durability durable;
  AMQP_VALUE capabilities_array;
  uint local_3c;
  AMQP_VALUE local_38;
  AMQP_VALUE local_30;
  
  pTVar3 = (TARGET_HANDLE)malloc(8);
  if (pTVar3 == (TARGET_HANDLE)0x0) {
    *target_handle = (TARGET_HANDLE)0x0;
    return 0x34ef;
  }
  pTVar3->composite_value = (AMQP_VALUE)0x0;
  *target_handle = pTVar3;
  pAVar4 = amqpvalue_get_inplace_described_value(value);
  if (pAVar4 != (AMQP_VALUE)0x0) {
    iVar1 = amqpvalue_get_list_item_count(pAVar4,&local_3c);
    if (iVar1 != 0) {
      return 0x34fe;
    }
    if (local_3c != 0) {
      pAVar5 = amqpvalue_get_list_item(pAVar4,0);
      if (pAVar5 != (AMQP_VALUE)0x0) {
        amqpvalue_destroy(pAVar5);
      }
      if (1 < local_3c) {
        pAVar5 = amqpvalue_get_list_item(pAVar4,1);
        if (pAVar5 != (AMQP_VALUE)0x0) {
          AVar2 = amqpvalue_get_type(pAVar5);
          if ((AVar2 != AMQP_TYPE_NULL) &&
             (iVar1 = amqpvalue_get_uint(pAVar5,(uint32_t *)&local_38), iVar1 != 0)) {
            amqpvalue_destroy(pAVar5);
            target_destroy(*target_handle);
            return 0x3527;
          }
          amqpvalue_destroy(pAVar5);
        }
        if (2 < local_3c) {
          pAVar5 = amqpvalue_get_list_item(pAVar4,2);
          if (pAVar5 != (AMQP_VALUE)0x0) {
            AVar2 = amqpvalue_get_type(pAVar5);
            if ((AVar2 != AMQP_TYPE_NULL) &&
               (iVar1 = amqpvalue_get_symbol(pAVar5,(char **)&local_38), iVar1 != 0)) {
              amqpvalue_destroy(pAVar5);
              target_destroy(*target_handle);
              return 0x3544;
            }
            amqpvalue_destroy(pAVar5);
          }
          if (3 < local_3c) {
            pAVar5 = amqpvalue_get_list_item(pAVar4,3);
            if (pAVar5 != (AMQP_VALUE)0x0) {
              AVar2 = amqpvalue_get_type(pAVar5);
              if ((AVar2 != AMQP_TYPE_NULL) &&
                 (iVar1 = amqpvalue_get_uint(pAVar5,(uint32_t *)&local_38), iVar1 != 0)) {
                amqpvalue_destroy(pAVar5);
                target_destroy(*target_handle);
                return 0x3561;
              }
              amqpvalue_destroy(pAVar5);
            }
            if (4 < local_3c) {
              pAVar5 = amqpvalue_get_list_item(pAVar4,4);
              if (pAVar5 != (AMQP_VALUE)0x0) {
                AVar2 = amqpvalue_get_type(pAVar5);
                if ((AVar2 != AMQP_TYPE_NULL) &&
                   (iVar1 = amqpvalue_get_boolean(pAVar5,(_Bool *)&local_38), iVar1 != 0)) {
                  amqpvalue_destroy(pAVar5);
                  target_destroy(*target_handle);
                  return 0x357e;
                }
                amqpvalue_destroy(pAVar5);
              }
              if (5 < local_3c) {
                pAVar5 = amqpvalue_get_list_item(pAVar4,5);
                if (pAVar5 != (AMQP_VALUE)0x0) {
                  AVar2 = amqpvalue_get_type(pAVar5);
                  if ((AVar2 != AMQP_TYPE_NULL) &&
                     (iVar1 = amqpvalue_get_map(pAVar5,&local_38), iVar1 != 0)) {
                    amqpvalue_destroy(pAVar5);
                    target_destroy(*target_handle);
                    return 0x359b;
                  }
                  amqpvalue_destroy(pAVar5);
                }
                if ((6 < local_3c) &&
                   (pAVar4 = amqpvalue_get_list_item(pAVar4,6), pAVar4 != (AMQP_VALUE)0x0)) {
                  AVar2 = amqpvalue_get_type(pAVar4);
                  if (AVar2 != AMQP_TYPE_NULL) {
                    local_38 = (AMQP_VALUE)0x0;
                    AVar2 = amqpvalue_get_type(pAVar4);
                    if (((AVar2 != AMQP_TYPE_ARRAY) ||
                        (iVar1 = amqpvalue_get_array(pAVar4,&local_30), iVar1 != 0)) &&
                       (iVar1 = amqpvalue_get_symbol(pAVar4,(char **)&local_38), iVar1 != 0)) {
                      amqpvalue_destroy(pAVar4);
                      target_destroy(*target_handle);
                      return 0x35ba;
                    }
                  }
                  amqpvalue_destroy(pAVar4);
                }
              }
            }
          }
        }
      }
    }
    pAVar4 = amqpvalue_clone(value);
    pTVar3->composite_value = pAVar4;
    return 0;
  }
  target_destroy(*target_handle);
  return 0x34f7;
}

Assistant:

int amqpvalue_get_target(AMQP_VALUE value, TARGET_HANDLE* target_handle)
{
    int result;
    TARGET_INSTANCE* target_instance = (TARGET_INSTANCE*)target_create_internal();
    *target_handle = target_instance;
    if (*target_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            target_destroy(*target_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* address */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* durable */
                    if (list_item_count > 1)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 1);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                terminus_durability durable;
                                if (amqpvalue_get_terminus_durability(item_value, &durable) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    target_destroy(*target_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* expiry-policy */
                    if (list_item_count > 2)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 2);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                terminus_expiry_policy expiry_policy;
                                if (amqpvalue_get_terminus_expiry_policy(item_value, &expiry_policy) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    target_destroy(*target_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* timeout */
                    if (list_item_count > 3)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 3);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                seconds timeout;
                                if (amqpvalue_get_seconds(item_value, &timeout) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    target_destroy(*target_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* dynamic */
                    if (list_item_count > 4)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 4);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                bool dynamic;
                                if (amqpvalue_get_boolean(item_value, &dynamic) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    target_destroy(*target_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* dynamic-node-properties */
                    if (list_item_count > 5)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 5);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                node_properties dynamic_node_properties;
                                if (amqpvalue_get_node_properties(item_value, &dynamic_node_properties) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    target_destroy(*target_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* capabilities */
                    if (list_item_count > 6)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 6);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* capabilities = NULL;
                                AMQP_VALUE capabilities_array;
                                if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, &capabilities_array) != 0)) &&
                                    (amqpvalue_get_symbol(item_value, &capabilities) != 0))
                                {
                                    amqpvalue_destroy(item_value);
                                    target_destroy(*target_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    target_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}